

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O3

client_socket * C_std::Network::easy_accept(client_socket *__return_storage_ptr__,int sockfd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined2 uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  socklen_t addr_len;
  sockaddr_in addr;
  char buf [8192];
  string local_2070;
  socklen_t local_204c;
  sockaddr local_2048;
  char local_2038 [8200];
  
  local_204c = 0x10;
  local_2048.sa_family = 0;
  local_2048.sa_data[0] = '\0';
  local_2048.sa_data[1] = '\0';
  local_2048.sa_data[2] = '\0';
  local_2048.sa_data[3] = '\0';
  local_2048.sa_data[4] = '\0';
  local_2048.sa_data[5] = '\0';
  local_2048.sa_data[6] = '\0';
  local_2048.sa_data[7] = '\0';
  local_2048.sa_data[8] = '\0';
  local_2048.sa_data[9] = '\0';
  local_2048.sa_data[10] = '\0';
  local_2048.sa_data[0xb] = '\0';
  local_2048.sa_data[0xc] = '\0';
  local_2048.sa_data[0xd] = '\0';
  iVar3 = Accept(sockfd,&local_2048,&local_204c);
  pcVar4 = inet_ntop(2,local_2048.sa_data + 2,local_2038,0x2000);
  paVar1 = &local_2070.field_2;
  if (pcVar4 == (char *)0x0) {
    local_2070._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2070,"af to ip error","");
    perror_exit(&local_2070);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2070._M_dataplus._M_p != paVar1) {
      operator_delete(local_2070._M_dataplus._M_p,local_2070.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = local_2048.sa_data._0_2_;
  local_2070._M_dataplus._M_p = (pointer)paVar1;
  sVar5 = strlen(local_2038);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2070,local_2038,local_2038 + sVar5);
  __return_storage_ptr__->sockfd = iVar3;
  (__return_storage_ptr__->ip)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->ip).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->ip,local_2070._M_dataplus._M_p,
             local_2070._M_dataplus._M_p + local_2070._M_string_length);
  __return_storage_ptr__->port = (uint)(ushort)(uVar2 << 8 | (ushort)uVar2 >> 8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2070._M_dataplus._M_p != paVar1) {
    operator_delete(local_2070._M_dataplus._M_p,local_2070.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

client_socket easy_accept(int sockfd) {
            struct sockaddr_in addr;
            socklen_t addr_len = sizeof(addr);
            memset(&addr, 0, sizeof(addr));
            int cfd = Accept(sockfd, reinterpret_cast<struct sockaddr *>(&addr), &addr_len);
            char buf[BUFSIZ];
            if (inet_ntop(AF_INET, &addr.sin_addr.s_addr, buf, BUFSIZ) == nullptr) {
                perror_exit("af to ip error");
            }
            return client_socket(cfd, ntohs(addr.sin_port), buf);
        }